

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::python::PyiGenerator::Generate
          (PyiGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  ulong uVar1;
  Options options_00;
  bool bVar2;
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  ZeroCopyOutputStream *output;
  FileDescriptor *pFVar6;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *output_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *option;
  pointer ppVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  string_view text;
  string_view text_00;
  string_view suffix;
  string filename;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  Printer printer;
  undefined1 *local_248;
  long local_240;
  undefined1 local_238;
  undefined7 uStack_237;
  GeneratorContext *local_228;
  string *local_220;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  undefined1 local_1f8;
  undefined7 uStack_1f7;
  string *psStack_1f0;
  undefined8 local_1e8;
  char *pcStack_1e0;
  undefined8 local_1d8;
  char *pcStack_1d0;
  undefined8 local_1c8;
  byte bStack_1c0;
  undefined1 uStack_1bf;
  undefined6 uStack_1be;
  string local_1b8;
  AlphaNum local_198;
  undefined1 local_168 [128];
  pointer local_e8;
  pointer local_d8;
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_d0;
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_b8;
  TypeErasedState local_98;
  ManagerType *local_88;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined4 extraout_var;
  
  output_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)context;
  local_220 = error;
  absl::lts_20250127::Mutex::Lock(&this->mutex_);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&this->import_map_);
  this->file_ = file;
  local_218.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  text._M_str = (char *)&local_218;
  text._M_len = (size_t)(parameter->_M_dataplus)._M_p;
  local_228 = context;
  ParseGeneratorParameter((compiler *)parameter->_M_string_length,text,output_00);
  ppVar3 = local_218.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_248 = &local_238;
  local_240 = 0;
  bVar4 = false;
  local_238 = 0;
  this->strip_nonfunctional_codegen_ = false;
  bVar11 = local_218.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_218.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar11) {
    bVar4 = false;
    ppVar7 = local_218.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar5 = std::__cxx11::string::compare((char *)ppVar7);
      if (iVar5 == 0) {
        bVar2 = true;
        bVar4 = true;
      }
      else {
        uVar1 = (ppVar7->first)._M_string_length;
        if ((uVar1 < 4) || (*(int *)((ppVar7->first)._M_dataplus._M_p + (uVar1 - 4)) != 0x6979702e))
        {
          iVar5 = std::__cxx11::string::compare((char *)ppVar7);
          if (iVar5 == 0) {
            this->strip_nonfunctional_codegen_ = true;
            bVar2 = true;
          }
          else {
            local_168._0_8_ = &DAT_0000001a;
            local_168._8_8_ = "Unknown generator option: ";
            local_198.piece_._M_str = (ppVar7->first)._M_dataplus._M_p;
            local_198.piece_._M_len = (ppVar7->first)._M_string_length;
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&local_1b8,(lts_20250127 *)local_168,&local_198,
                       (AlphaNum *)local_198.piece_._M_len);
            std::__cxx11::string::operator=((string *)local_220,(string *)&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            bVar2 = false;
          }
        }
        else {
          bVar2 = true;
          std::__cxx11::string::_M_assign((string *)&local_248);
        }
      }
      if (!bVar2) break;
      ppVar7 = ppVar7 + 1;
      bVar11 = ppVar7 == ppVar3;
    } while (!bVar11);
  }
  if (bVar11 != false) {
    if (local_240 == 0) {
      suffix._M_str = (char *)error;
      suffix._M_len = (size_t)".pyi";
      GetFileName_abi_cxx11_
                ((string *)local_168,(python *)file,(FileDescriptor *)&DAT_00000004,suffix);
      std::__cxx11::string::operator=((string *)&local_248,(string *)local_168);
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      }
    }
    iVar5 = (*local_228->_vptr_GeneratorContext[2])();
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5);
    if (output == (ZeroCopyOutputStream *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/pyi_generator.cc"
                 ,0x272,"output.get()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_168);
    }
    GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&local_198,(Arena *)0x0);
    local_1b8._M_dataplus._M_p = (pointer)&PTR__AnnotationCollector_01956fd8;
    psStack_1f0 = (string *)0x0;
    if (bVar4) {
      psStack_1f0 = &local_1b8;
    }
    local_1f8 = 0x24;
    local_1e8 = 2;
    pcStack_1e0 = "//";
    local_1d8 = 3;
    pcStack_1d0 = "//~";
    local_1c8 = 4;
    uStack_1bf = 0;
    options_00._1_7_ = uStack_1f7;
    options_00.variable_delimiter = 0x24;
    options_00.enable_codegen_trace.super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool>._M_engaged = false;
    options_00.enable_codegen_trace.super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool>._M_payload = (_Storage<bool,_true>)bStack_1c0;
    options_00._58_6_ = uStack_1be;
    options_00.annotation_collector = (AnnotationCollector *)psStack_1f0;
    options_00.comment_start._M_len = 2;
    options_00.comment_start._M_str = "//";
    options_00.ignored_comment_start._M_len = 3;
    options_00.ignored_comment_start._M_str = "//~";
    options_00.spaces_per_indent = 4;
    local_1b8._M_string_length = (size_type)&local_198;
    io::Printer::Printer((Printer *)local_168,output,options_00);
    this->printer_ = (Printer *)local_168;
    PrintImports(this);
    text_00._M_str = "DESCRIPTOR: _descriptor.FileDescriptor\n";
    text_00._M_len = 0x27;
    io::Printer::Print<>(this->printer_,text_00);
    pFVar6 = this->file_;
    if (0 < pFVar6->public_dependency_count_) {
      lVar10 = 0;
      do {
        pFVar6 = FileDescriptor::dependency(pFVar6,pFVar6->public_dependencies_[lVar10]);
        PrintExtensions<google::protobuf::FileDescriptor>(this,pFVar6);
        if (0 < pFVar6->enum_type_count_) {
          lVar9 = 0;
          lVar8 = 0;
          do {
            PrintEnumValues(this,(EnumDescriptor *)(&pFVar6->enum_types_->super_SymbolBase + lVar9),
                            false);
            lVar8 = lVar8 + 1;
            lVar9 = lVar9 + 0x58;
          } while (lVar8 < pFVar6->enum_type_count_);
        }
        lVar10 = lVar10 + 1;
        pFVar6 = this->file_;
      } while (lVar10 < pFVar6->public_dependency_count_);
    }
    PrintTopLevelEnums(this);
    pFVar6 = this->file_;
    if (0 < pFVar6->enum_type_count_) {
      lVar10 = 0;
      lVar8 = 0;
      do {
        PrintEnumValues(this,(EnumDescriptor *)(&pFVar6->enum_types_->super_SymbolBase + lVar10),
                        false);
        lVar8 = lVar8 + 1;
        pFVar6 = this->file_;
        lVar10 = lVar10 + 0x58;
      } while (lVar8 < pFVar6->enum_type_count_);
    }
    PrintExtensions<google::protobuf::FileDescriptor>(this,pFVar6);
    PrintMessages(this);
    if ((this->opensource_runtime_ == true) && (bVar4 = HasGenericServices(file), bVar4)) {
      PrintServices(this);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~raw_hash_set(&local_78);
    (*local_88)(dispose,&local_98,&local_98);
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::~vector(&local_b8);
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::~vector(&local_d0);
    if (local_e8 != (pointer)0x0) {
      operator_delete(local_e8,(long)local_d8 - (long)local_e8);
    }
    if (local_168._16_8_ != 0) {
      (**(code **)(*(long *)local_168._0_8_ + 0x18))();
    }
    GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)&local_198);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_218);
  absl::lts_20250127::Mutex::Unlock(&this->mutex_);
  return bVar11;
}

Assistant:

bool PyiGenerator::Generate(const FileDescriptor* file,
                            const std::string& parameter,
                            GeneratorContext* context,
                            std::string* error) const {
  absl::MutexLock lock(&mutex_);
  import_map_.clear();
  // Calculate file name.
  file_ = file;
  // In google3, devtools/python/bazel/pytype/pytype_impl.bzl uses --pyi_out to
  // directly set the output file name.
  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);

  std::string filename;
  bool annotate_code = false;
  strip_nonfunctional_codegen_ = false;
  for (const std::pair<std::string, std::string>& option : options) {
    if (option.first == "annotate_code") {
      annotate_code = true;
    } else if (absl::EndsWith(option.first, ".pyi")) {
      filename = option.first;
    } else if (option.first == "experimental_strip_nonfunctional_codegen") {
      strip_nonfunctional_codegen_ = true;
    } else {
      *error = absl::StrCat("Unknown generator option: ", option.first);
      return false;
    }
  }

  if (filename.empty()) {
    filename = GetFileName(file, ".pyi");
  }

  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  ABSL_CHECK(output.get());
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);
  io::Printer::Options printer_opt(
      '$', annotate_code ? &annotation_collector : nullptr);
  printer_opt.spaces_per_indent = 4;
  io::Printer printer(output.get(), printer_opt);
  printer_ = &printer;

  PrintImports();
  printer_->Print("DESCRIPTOR: _descriptor.FileDescriptor\n");

  // Prints extensions and enums from imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    const FileDescriptor* public_dep = file_->public_dependency(i);
    PrintExtensions(*public_dep);
    for (int i = 0; i < public_dep->enum_type_count(); ++i) {
      const EnumDescriptor* enum_descriptor = public_dep->enum_type(i);
      PrintEnumValues(*enum_descriptor);
    }
  }

  PrintTopLevelEnums();
  // Prints top level enum values
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    PrintEnumValues(*file_->enum_type(i));
  }
  // Prints top level Extensions
  PrintExtensions(*file_);
  PrintMessages();

  if (opensource_runtime_ && HasGenericServices(file)) {
    PrintServices();
  }
  return true;
}